

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::f_fdot(Forth *this)

{
  long lVar1;
  long lVar2;
  Cell CVar3;
  uint uVar4;
  double dVar5;
  
  requireFStackDepth(this,1,"F.");
  if (this->writeToTarget == ToStdCout) {
    CVar3 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar1 = std::cout;
    if (CVar3 == 8) {
      uVar4 = 0x40;
    }
    else if (CVar3 == 10) {
      uVar4 = 2;
    }
    else {
      uVar4 = (uint)(CVar3 == 0x10) << 3;
    }
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | uVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(std::ostream::write + lVar2) = *(uint *)(std::ostream::write + lVar2) & 0xfffffefb | 4
    ;
    *(long *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = (long)(int)this->precision_;
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::_M_insert<double>(dVar5);
    std::ostream::flush();
  }
  else if (this->writeToTarget == ToString) {
    CVar3 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar1 = *(long *)&this->field_0x20;
    if (CVar3 == 8) {
      uVar4 = 0x40;
    }
    else if (CVar3 == 10) {
      uVar4 = 2;
    }
    else {
      uVar4 = (uint)(CVar3 == 0x10) << 3;
    }
    *(uint *)(&this->field_0x38 + *(long *)(lVar1 + -0x18)) =
         *(uint *)(&this->field_0x38 + *(long *)(lVar1 + -0x18)) & 0xffffffb5 | uVar4;
    *(uint *)(&this->field_0x38 + *(long *)(lVar1 + -0x18)) =
         *(uint *)(&this->field_0x38 + *(long *)(lVar1 + -0x18)) & 0xfffffefb | 4;
    *(long *)(&this->field_0x28 + *(long *)(lVar1 + -0x18)) = (long)(int)this->precision_;
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::_M_insert<double>(dVar5);
  }
  ForthStack<double>::pop(&this->fStack);
  return;
}

Assistant:

void f_fdot() {
			REQUIRE_FSTACK_DEPTH(1, "F.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::fixed << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::fixed << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				std::cout.flush(); 
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}